

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  const_iterator cVar1;
  bool bVar2;
  int iVar3;
  reference ppcVar4;
  undefined4 extraout_var;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_98;
  __normal_iterator<cmGlobalGeneratorFactory_**,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_90;
  __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
  local_88;
  const_iterator i;
  cmGlobalGenerator *generator;
  string local_68 [8];
  string name;
  cmExternalMakefileProjectGenerator *extraGenerator;
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra;
  string *gname_local;
  cmake *this_local;
  
  extra.second.field_2._8_8_ = gname;
  createExtraGenerator
            ((pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&extraGenerator,&this->ExtraGenerators,gname);
  name.field_2._8_8_ = extraGenerator;
  std::__cxx11::string::string(local_68,(string *)&extra);
  i._M_current = (cmGlobalGeneratorFactory **)0x0;
  local_90._M_current =
       (cmGlobalGeneratorFactory **)
       std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::begin
                 (&this->Generators);
  __gnu_cxx::
  __normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
  ::__normal_iterator<cmGlobalGeneratorFactory**>
            ((__normal_iterator<cmGlobalGeneratorFactory*const*,std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
              *)&local_88,&local_90);
  while( true ) {
    local_98._M_current =
         (cmGlobalGeneratorFactory **)
         std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::end
                   (&this->Generators);
    bVar2 = __gnu_cxx::operator!=(&local_88,&local_98);
    if (!bVar2) break;
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
              ::operator*(&local_88);
    iVar3 = (*(*ppcVar4)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar4,local_68,this);
    i._M_current = (cmGlobalGeneratorFactory **)CONCAT44(extraout_var,iVar3);
    if (i._M_current != (cmGlobalGeneratorFactory **)0x0) break;
    __gnu_cxx::
    __normal_iterator<cmGlobalGeneratorFactory_*const_*,_std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>_>
    ::operator++(&local_88);
  }
  if (i._M_current == (cmGlobalGeneratorFactory **)0x0) {
    if (name.field_2._8_8_ != 0) {
      (**(code **)(*(long *)name.field_2._8_8_ + 8))();
    }
  }
  else {
    cmGlobalGenerator::SetExternalMakefileProjectGenerator
              ((cmGlobalGenerator *)i._M_current,
               (cmExternalMakefileProjectGenerator *)name.field_2._8_8_);
  }
  cVar1._M_current = i._M_current;
  std::__cxx11::string::~string(local_68);
  std::
  pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<cmExternalMakefileProjectGenerator_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&extraGenerator);
  return (cmGlobalGenerator *)cVar1._M_current;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  std::pair<cmExternalMakefileProjectGenerator*, std::string> extra =
    createExtraGenerator(this->ExtraGenerators, gname);
  cmExternalMakefileProjectGenerator* extraGenerator = extra.first;
  const std::string name = extra.second;

  cmGlobalGenerator* generator = CM_NULLPTR;
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator) {
      break;
    }
  }

  if (generator) {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
  } else {
    delete extraGenerator;
  }

  return generator;
}